

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::ClearAllHighlights(BoardView *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  
  p_Var1 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
            (&this->m_pinHighlighted);
  FindNetNoClear(this,"");
  FindComponent(this,"");
  this->m_search[0][0] = '\0';
  this->m_search[1][0] = '\0';
  this->m_search[2][0] = '\0';
  this->m_active_search_column = 0;
  this->m_needsRedraw = true;
  if (this->m_board != (Board *)0x0) {
    iVar4 = (*this->m_board->_vptr_Board[3])();
    plVar2 = (long *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
    for (plVar5 = *(long **)CONCAT44(extraout_var,iVar4); plVar5 != plVar2; plVar5 = plVar5 + 2) {
      lVar3 = *plVar5;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        *(undefined1 *)(lVar3 + 0xe0) = 0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
        *(undefined1 *)(lVar3 + 0xe0) = 0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
      }
    }
  }
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
            (&this->m_partHighlighted);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
            (&this->m_pinHighlighted);
  return;
}

Assistant:

void BoardView::ClearAllHighlights(void) {
	m_pinSelected = nullptr;
	FindNet("");
	FindComponent("");
	ResetSearch();
	m_needsRedraw      = true;
	if (m_board != NULL) {
		for (auto part : m_board->Components()) part->visualmode = part->CVMNormal;
	}
	m_partHighlighted.clear();
	m_pinHighlighted.clear();
}